

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_unittest.cpp
# Opt level: O3

void __thiscall Allocator_padding_Test::TestBody(Allocator_padding_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 0)","0",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000007;
  local_20.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 1)","7",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000006;
  local_20.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 2)","6",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000005;
  local_20.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 3)","5",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
  local_20.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 4)","4",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_20.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 5)","3",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_20.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 6)","2",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_20.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 7)","1",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 8)","0",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000007;
  local_20.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 9)","7",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000006;
  local_20.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 10)","6",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000005;
  local_20.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 11)","5",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
  local_20.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 12)","4",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_20.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 13)","3",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_20.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 14)","2",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_20.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 15)","1",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<char>(8, 16)","0",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<double>(64, 0)","0",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000007;
  local_20.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<double>(64, 1)","7",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000006;
  local_20.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<double>(64, 2)","6",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000005;
  local_20.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<double>(64, 3)","5",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
  local_20.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<double>(64, 4)","4",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_20.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<double>(64, 5)","3",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_20.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<double>(64, 6)","2",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_20.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<double>(64, 7)","1",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_18,"get_padding<double>(64, 8)","0",(unsigned_long *)&local_28,(int *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/allocator_unittest.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Allocator, padding) {
    using namespace memory::impl;

    EXPECT_EQ( get_padding<char>(8,  0), 0 );
    EXPECT_EQ( get_padding<char>(8,  1), 7 );
    EXPECT_EQ( get_padding<char>(8,  2), 6 );
    EXPECT_EQ( get_padding<char>(8,  3), 5 );
    EXPECT_EQ( get_padding<char>(8,  4), 4 );
    EXPECT_EQ( get_padding<char>(8,  5), 3 );
    EXPECT_EQ( get_padding<char>(8,  6), 2 );
    EXPECT_EQ( get_padding<char>(8,  7), 1 );
    EXPECT_EQ( get_padding<char>(8,  8), 0 );

    EXPECT_EQ( get_padding<char>(8,  9), 7 );
    EXPECT_EQ( get_padding<char>(8, 10), 6 );
    EXPECT_EQ( get_padding<char>(8, 11), 5 );
    EXPECT_EQ( get_padding<char>(8, 12), 4 );
    EXPECT_EQ( get_padding<char>(8, 13), 3 );
    EXPECT_EQ( get_padding<char>(8, 14), 2 );
    EXPECT_EQ( get_padding<char>(8, 15), 1 );
    EXPECT_EQ( get_padding<char>(8, 16), 0 );

    EXPECT_EQ( get_padding<double>(64, 0), 0 );
    EXPECT_EQ( get_padding<double>(64, 1), 7 );
    EXPECT_EQ( get_padding<double>(64, 2), 6 );
    EXPECT_EQ( get_padding<double>(64, 3), 5 );
    EXPECT_EQ( get_padding<double>(64, 4), 4 );
    EXPECT_EQ( get_padding<double>(64, 5), 3 );
    EXPECT_EQ( get_padding<double>(64, 6), 2 );
    EXPECT_EQ( get_padding<double>(64, 7), 1 );
    EXPECT_EQ( get_padding<double>(64, 8), 0 );
}